

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool cmTarFilesFrom(string *file,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *files)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_748 [32];
  undefined1 local_728 [8];
  ostringstream e_2;
  value_type local_5b0;
  undefined1 local_590 [8];
  string line;
  string local_568 [32];
  undefined1 local_548 [8];
  ostringstream e_1;
  long local_3d0;
  ifstream fin;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *file_local;
  
  bVar1 = cmsys::SystemTools::FileIsDirectory(file);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"-E tar --files-from= file \'");
    poVar5 = std::operator<<(poVar5,(string *)file);
    std::operator<<(poVar5,"\' is a directory");
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_1c8);
    file_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_3d0,pcVar3,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&local_3d0 + *(long *)(local_3d0 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)local_590);
      while (bVar1 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_3d0,(string *)local_590,(bool *)0x0,-1), bVar1) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,12ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_590,(char (*) [12])"--add-file=");
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_5b0,(ulong)local_590);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,&local_5b0);
            std::__cxx11::string::~string((string *)&local_5b0);
          }
          else {
            bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_590,(char (*) [2])0x9083e3);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
              poVar5 = std::operator<<((ostream *)local_728,"-E tar --files-from=\'");
              poVar5 = std::operator<<(poVar5,(string *)file);
              poVar5 = std::operator<<(poVar5,"\' file invalid line:\n");
              poVar5 = std::operator<<(poVar5,(string *)local_590);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_748);
              file_local._7_1_ = false;
              line.field_2._12_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
              goto LAB_004383b1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,(value_type *)local_590);
          }
        }
      }
      file_local._7_1_ = true;
      line.field_2._12_4_ = 1;
LAB_004383b1:
      std::__cxx11::string::~string((string *)local_590);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
      poVar5 = std::operator<<((ostream *)local_548,"-E tar --files-from= file \'");
      poVar5 = std::operator<<(poVar5,(string *)file);
      std::operator<<(poVar5,"\' not found");
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_568);
      file_local._7_1_ = false;
      line.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
    }
    std::ifstream::~ifstream(&local_3d0);
  }
  return file_local._7_1_;
}

Assistant:

static bool cmTarFilesFrom(std::string const& file,
                           std::vector<std::string>& files)
{
  if (cmSystemTools::FileIsDirectory(file))
    {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' is a directory";
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  cmsys::ifstream fin(file.c_str());
  if (!fin)
    {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' not found";
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line))
    {
    if (line.empty())
      {
      continue;
      }
    if (cmHasLiteralPrefix(line, "--add-file="))
      {
      files.push_back(line.substr(11));
      }
    else if (cmHasLiteralPrefix(line, "-"))
      {
      std::ostringstream e;
      e << "-E tar --files-from='" << file << "' file invalid line:\n"
        << line << "\n";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    else
      {
      files.push_back(line);
      }
    }
  return true;
}